

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

int share_listen_accepting(Plug *plug,accept_fn_t constructor,accept_ctx_t ctx)

{
  ssh_sharing_state *sharestate;
  uint uVar1;
  ssh_sharing_connstate *cs;
  Socket *pSVar2;
  char *pcVar3;
  tree234 *ptVar4;
  SocketPeerInfo *pi;
  char *pcVar5;
  int iVar6;
  
  sharestate = (ssh_sharing_state *)(plug + -6);
  cs = (ssh_sharing_connstate *)safemalloc(1,0x4088,0);
  (cs->plug).vt = &ssh_sharing_conn_plugvt;
  cs->parent = sharestate;
  uVar1 = share_find_unused_id(sharestate,*(uint *)&plug[-3].vt);
  cs->id = uVar1;
  if (uVar1 == 0) {
    uVar1 = share_find_unused_id(sharestate,1);
    cs->id = uVar1;
    if (uVar1 == 0) {
      safefree(cs);
      return 1;
    }
  }
  *(uint *)&plug[-3].vt = uVar1 + 1 + (uint)(uVar1 == 0xffffffff);
  pSVar2 = (*constructor)(ctx,&cs->plug);
  cs->sock = pSVar2;
  pcVar3 = (*pSVar2->vt->socket_error)(pSVar2);
  if (pcVar3 == (char *)0x0) {
    (*cs->sock->vt->set_frozen)(cs->sock,false);
    add234(cs->parent->connections,cs);
    cs->sent_verstring = false;
    if (plug[-1].vt != (PlugVtable *)0x0) {
      share_send_verstring(cs);
    }
    cs->got_verstring = false;
    cs->recvlen = 0;
    cs->crLine = 0;
    ptVar4 = newtree234(share_halfchannel_cmp);
    cs->halfchannels = ptVar4;
    ptVar4 = newtree234(share_channel_us_cmp);
    cs->channels_by_us = ptVar4;
    ptVar4 = newtree234(share_channel_server_cmp);
    cs->channels_by_server = ptVar4;
    ptVar4 = newtree234(share_xchannel_us_cmp);
    cs->xchannels_by_us = ptVar4;
    ptVar4 = newtree234(share_xchannel_server_cmp);
    cs->xchannels_by_server = ptVar4;
    ptVar4 = newtree234(share_forwarding_cmp);
    cs->forwardings = ptVar4;
    cs->globreq_head = (share_globreq *)0x0;
    cs->globreq_tail = (share_globreq *)0x0;
    pi = (*cs->sock->vt->peer_info)(cs->sock);
    if (pi == (SocketPeerInfo *)0x0) {
      pcVar5 = anon_var_dwarf_3489d + 10;
      pcVar3 = anon_var_dwarf_3489d + 10;
    }
    else {
      pcVar3 = pi->log_text;
      pcVar5 = " from ";
      if (pcVar3 == (char *)0x0) {
        pcVar5 = anon_var_dwarf_3489d + 10;
        pcVar3 = anon_var_dwarf_3489d + 10;
      }
    }
    iVar6 = 0;
    log_downstream(cs,"connected%s%s",pcVar5,pcVar3);
    sk_free_peer_info(pi);
  }
  else {
    safefree(cs);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int share_listen_accepting(Plug *plug,
                                  accept_fn_t constructor, accept_ctx_t ctx)
{
    struct ssh_sharing_state *sharestate = container_of(
        plug, struct ssh_sharing_state, plug);
    struct ssh_sharing_connstate *cs;
    const char *err;
    SocketPeerInfo *peerinfo;

    /*
     * A new downstream has connected to us.
     */
    cs = snew(struct ssh_sharing_connstate);
    cs->plug.vt = &ssh_sharing_conn_plugvt;
    cs->parent = sharestate;

    if ((cs->id = share_find_unused_id(sharestate, sharestate->nextid)) == 0 &&
        (cs->id = share_find_unused_id(sharestate, 1)) == 0) {
        sfree(cs);
        return 1;
    }
    sharestate->nextid = cs->id + 1;
    if (sharestate->nextid == 0)
        sharestate->nextid++; /* only happens in VERY long-running upstreams */

    cs->sock = constructor(ctx, &cs->plug);
    if ((err = sk_socket_error(cs->sock)) != NULL) {
        sfree(cs);
        return err != NULL;
    }

    sk_set_frozen(cs->sock, false);

    add234(cs->parent->connections, cs);

    cs->sent_verstring = false;
    if (sharestate->server_verstring)
        share_send_verstring(cs);

    cs->got_verstring = false;
    cs->recvlen = 0;
    cs->crLine = 0;
    cs->halfchannels = newtree234(share_halfchannel_cmp);
    cs->channels_by_us = newtree234(share_channel_us_cmp);
    cs->channels_by_server = newtree234(share_channel_server_cmp);
    cs->xchannels_by_us = newtree234(share_xchannel_us_cmp);
    cs->xchannels_by_server = newtree234(share_xchannel_server_cmp);
    cs->forwardings = newtree234(share_forwarding_cmp);
    cs->globreq_head = cs->globreq_tail = NULL;

    peerinfo = sk_peer_info(cs->sock);
    log_downstream(cs, "connected%s%s",
                   (peerinfo && peerinfo->log_text ? " from " : ""),
                   (peerinfo && peerinfo->log_text ? peerinfo->log_text : ""));
    sk_free_peer_info(peerinfo);

    return 0;
}